

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestCoverageHandler.cxx
# Opt level: O3

string * joinCommandLine(string *__return_storage_ptr__,
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *args)

{
  pointer pcVar1;
  string *psVar2;
  long lVar3;
  long *plVar4;
  undefined8 uVar5;
  size_type *psVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  _Alloc_hider _Var7;
  __string_type __str;
  size_type *local_78;
  ulong local_70;
  size_type local_68;
  long lStack_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_58 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_58;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args != in_RDX) {
    do {
      lVar3 = std::__cxx11::string::find((char)args,0x20);
      if (lVar3 == -1) {
        pcVar1 = (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args)->
                 _M_dataplus)._M_p;
        local_78 = &local_68;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_78,pcVar1,
                   pcVar1 + ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            args)->_M_string_length);
        std::__cxx11::string::_M_replace_aux((ulong)&local_78,local_70,0,'\x01');
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
        uVar5 = local_68;
        _Var7._M_p = (pointer)local_78;
        if (local_78 != &local_68) goto LAB_00179d2d;
      }
      else {
        std::operator+(&local_50,"\"",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
        psVar6 = (size_type *)(plVar4 + 2);
        if ((size_type *)*plVar4 == psVar6) {
          local_68 = *psVar6;
          lStack_60 = plVar4[3];
          local_78 = &local_68;
        }
        else {
          local_68 = *psVar6;
          local_78 = (size_type *)*plVar4;
        }
        local_70 = plVar4[1];
        *plVar4 = (long)psVar6;
        plVar4[1] = 0;
        *(undefined1 *)(plVar4 + 2) = 0;
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
        if (local_78 != &local_68) {
          operator_delete(local_78,local_68 + 1);
        }
        uVar5 = local_50.field_2._M_allocated_capacity;
        _Var7._M_p = local_50._M_dataplus._M_p;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
LAB_00179d2d:
          operator_delete(_Var7._M_p,uVar5 + 1);
        }
      }
      args = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)((long)args + 0x20);
    } while ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args != in_RDX);
    psVar2 = (string *)__return_storage_ptr__->_M_string_length;
    if (psVar2 != (string *)0x0) {
      __return_storage_ptr__->_M_string_length = (size_type)((long)&psVar2[-1].field_2 + 0xf);
      ((__return_storage_ptr__->_M_dataplus)._M_p + -1)[(long)psVar2] = '\0';
      return psVar2;
    }
  }
  uVar5 = std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",
                     0xffffffffffffffff,0);
  plVar4 = (long *)(__return_storage_ptr__->_M_dataplus)._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)plVar4 != local_58) {
    operator_delete(plVar4,local_58->_M_allocated_capacity + 1);
  }
  _Unwind_Resume(uVar5);
}

Assistant:

static std::string joinCommandLine(const std::vector<std::string>& args)
{
  std::string ret;

  for (std::string const& s : args) {
    if (s.find(' ') == std::string::npos) {
      ret += s + ' ';
    } else {
      ret += "\"" + s + "\" ";
    }
  }

  // drop trailing whitespace
  ret.erase(ret.size() - 1);

  return ret;
}